

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CKey *key,CPubKey *pubkey)

{
  WalletStorage *pWVar1;
  array<unsigned_char,_32UL> *paVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  mapped_type *this_00;
  pointer __dest;
  mapped_type *pmVar9;
  long lVar10;
  uint256 *puVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  size_t __n;
  long in_FS_OFFSET;
  byte bVar14;
  CKeyingMaterial secret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_d8;
  CKeyID local_b4;
  uint256 local_a0 [2];
  uchar local_60;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_58;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
  iVar6 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar6 != '\0') {
LAB_004f16c3:
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x90d,
                  "bool wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  CPubKey::GetID((CKeyID *)local_a0,pubkey);
  iVar7 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::find(&(this->m_map_keys)._M_t,(key_type *)local_a0);
  if ((_Rb_tree_header *)iVar7._M_node == &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header) {
    CPubKey::GetID((CKeyID *)&local_58,pubkey);
    iVar8 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->m_map_crypted_keys)._M_t,(key_type *)&local_58);
    bVar5 = true;
    if ((_Rb_tree_header *)iVar8._M_node ==
        &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header) {
      iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
      if ((char)iVar6 == '\0') {
        CPubKey::GetID((CKeyID *)local_a0,pubkey);
        this_00 = std::
                  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                  ::operator[](&this->m_map_keys,(key_type *)local_a0);
        CKey::operator=(this_00,key);
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_a0,this);
        CKey::GetPrivKey((CPrivKey *)&local_58,key);
        bVar5 = WalletBatch::WriteDescriptorKey(batch,local_a0,pubkey,(CPrivKey *)&local_58);
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_58)
        ;
      }
      else {
        iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])();
        if ((char)iVar6 == '\0') {
          local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          paVar2 = (key->keydata)._M_t.
                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
          local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_char,secure_allocator<unsigned_char>>::
          _M_range_initialize<unsigned_char_const*>
                    ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_d8,paVar2,
                     paVar2 + (paVar2 != (array<unsigned_char,_32UL> *)0x0));
          pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
          local_e8 = (code *)0x0;
          pcStack_e0 = (code *)0x0;
          local_f8 = (undefined8 *)0x0;
          uStack_f0 = 0;
          local_f8 = (undefined8 *)operator_new(0x18);
          *local_f8 = (vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_d8;
          local_f8[1] = pubkey;
          local_f8[2] = &local_58;
          pcStack_e0 = std::
                       _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                       ::_M_invoke;
          local_e8 = std::
                     _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                     ::_M_manager;
          iVar6 = (*pWVar1->_vptr_WalletStorage[8])(pWVar1);
          if (local_e8 != (code *)0x0) {
            (*local_e8)(&local_f8,&local_f8,3);
          }
          if ((char)iVar6 == '\0') {
            bVar5 = false;
          }
          else {
            memcpy(local_a0,pubkey,0x41);
            uVar13 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58._M_impl.super__Vector_impl_data._M_start;
            if (uVar13 == 0) {
              __dest = (pointer)0x0;
              __n = 0;
            }
            else {
              if ((long)uVar13 < 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_alloc();
                  goto LAB_004f16c3;
                }
                goto LAB_004f17a0;
              }
              __dest = (pointer)operator_new(uVar13);
              __n = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58._M_impl.super__Vector_impl_data._M_start;
            }
            if (local_58._M_impl.super__Vector_impl_data._M_finish !=
                local_58._M_impl.super__Vector_impl_data._M_start) {
              memmove(__dest,local_58._M_impl.super__Vector_impl_data._M_start,__n);
            }
            CPubKey::GetID(&local_b4,pubkey);
            pmVar9 = std::
                     map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ::operator[](&this->m_map_crypted_keys,&local_b4);
            puVar11 = local_a0;
            pmVar12 = pmVar9;
            for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(undefined8 *)(pmVar12->first).vch =
                   *(undefined8 *)(puVar11->super_base_blob<256U>).m_data._M_elems;
              puVar11 = (uint256 *)((long)puVar11 + ((ulong)bVar14 * -2 + 1) * 8);
              pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar14 * -0x10 + 8);
            }
            (pmVar9->first).vch[0x40] = local_60;
            puVar3 = (pmVar9->second).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar4 = (pmVar9->second).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (pmVar9->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = __dest;
            (pmVar9->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
            (pmVar9->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar13;
            if (puVar3 != (pointer)0x0) {
              operator_delete(puVar3,(long)puVar4 - (long)puVar3);
            }
            (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_a0,this);
            bVar5 = WalletBatch::WriteCryptedDescriptorKey
                              (batch,local_a0,pubkey,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&local_d8);
          if (local_58._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          bVar5 = false;
        }
      }
    }
  }
  else {
    bVar5 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_004f17a0:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch& batch, const CKey& key, const CPubKey &pubkey)
{
    AssertLockHeld(cs_desc_man);
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // Check if provided key already exists
    if (m_map_keys.find(pubkey.GetID()) != m_map_keys.end() ||
        m_map_crypted_keys.find(pubkey.GetID()) != m_map_crypted_keys.end()) {
        return true;
    }

    if (m_storage.HasEncryptionKeys()) {
        if (m_storage.IsLocked()) {
            return false;
        }

        std::vector<unsigned char> crypted_secret;
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
                return EncryptSecret(encryption_key, secret, pubkey.GetHash(), crypted_secret);
            })) {
            return false;
        }

        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        return batch.WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    } else {
        m_map_keys[pubkey.GetID()] = key;
        return batch.WriteDescriptorKey(GetID(), pubkey, key.GetPrivKey());
    }
}